

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O2

bool __thiscall cmParseGTMCoverage::ReadMCovFile(cmParseGTMCoverage *this,char *file)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  cmCTest *pcVar5;
  bool bVar6;
  __type _Var7;
  long lVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  int iVar11;
  string_view str;
  int count;
  int linenumber;
  string routine;
  long local_4a0;
  string filepath;
  string function;
  char *local_450 [4];
  string lastpath;
  string lastroutine;
  string lastfunction;
  string line;
  ostringstream cmCTestLog_msg;
  ifstream in;
  uint auStack_218 [122];
  
  std::ifstream::ifstream(&in,file,_S_in);
  uVar2 = *(uint *)((long)auStack_218 + (long)_in[-3]);
  if ((uVar2 & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    lastfunction._M_dataplus._M_p = (pointer)&lastfunction.field_2;
    lastfunction._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    lastfunction.field_2._M_local_buf[0] = '\0';
    lastroutine._M_dataplus._M_p = (pointer)&lastroutine.field_2;
    lastroutine._M_string_length = 0;
    lastpath._M_dataplus._M_p = (pointer)&lastpath.field_2;
    lastpath._M_string_length = 0;
    lastroutine.field_2._M_local_buf[0] = '\0';
    lastpath.field_2._M_local_buf[0] = '\0';
    local_4a0 = 0;
    while( true ) {
      bVar6 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&in,&line,(bool *)0x0,0xffffffffffffffff);
      if (!bVar6) break;
      lVar8 = std::__cxx11::string::find((char *)&line,0x70d551);
      if (lVar8 != -1) {
        filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
        filepath._M_string_length = 0;
        filepath.field_2._M_local_buf[0] = '\0';
        function._M_dataplus._M_p = (pointer)&function.field_2;
        function._M_string_length = 0;
        routine._M_dataplus._M_p = (pointer)&routine.field_2;
        routine._M_string_length = 0;
        function.field_2._M_local_buf[0] = '\0';
        linenumber = 0;
        routine.field_2._M_local_buf[0] = '\0';
        count = 0;
        ParseMCOVLine(this,&line,&routine,&function,&linenumber,&count);
        bVar6 = std::operator==(&routine,"RSEL");
        if (!bVar6) {
          _Var7 = std::operator==(&function,&lastfunction);
          if (_Var7) {
            _Var7 = std::operator==(&lastroutine,&routine);
            iVar3 = count;
            if (_Var7) {
              if (lastpath._M_string_length == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
                poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Can not find mumps file : ");
                poVar10 = std::operator<<(poVar10,(string *)&lastroutine);
                poVar10 = std::operator<<(poVar10,"  referenced in this line of mcov data:\n[");
                poVar10 = std::operator<<(poVar10,(string *)&line);
                std::operator<<(poVar10,"]\n");
                pcVar5 = (this->super_cmParseMumpsCoverage).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar5,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                             ,0x52,local_450[0],false);
                std::__cxx11::string::~string((string *)local_450);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              }
              else {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                         ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                      &lastpath);
                piVar1 = (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)(int)local_4a0 + (long)linenumber;
                *piVar1 = *piVar1 + iVar3;
              }
              goto LAB_001b849e;
            }
          }
          bVar6 = cmParseMumpsCoverage::FindMumpsFile
                            (&this->super_cmParseMumpsCoverage,&routine,&filepath);
          if (bVar6) {
LAB_001b8303:
            _cmCTestLog_msg = 0;
            bVar6 = FindFunctionInMumpsFile(this,&filepath,&function,(int *)&cmCTestLog_msg);
            if (bVar6) {
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                    &filepath);
              local_4a0 = (long)_cmCTestLog_msg;
              piVar4 = (pmVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              iVar3 = piVar4[linenumber + local_4a0];
              iVar11 = iVar3;
              if (0 < count) {
                iVar11 = 0;
              }
              if (iVar3 != -1) {
                iVar11 = iVar3;
              }
              piVar4[linenumber + local_4a0] = iVar11 + count;
            }
          }
          else {
            str._M_str = routine._M_dataplus._M_p;
            str._M_len = routine._M_string_length;
            bVar6 = cmHasLiteralSuffix<2ul>(str,(char (*) [2])0x7295d6);
            if (bVar6) {
              std::__cxx11::string::erase((ulong)&routine,0);
              bVar6 = cmParseMumpsCoverage::FindMumpsFile
                                (&this->super_cmParseMumpsCoverage,&routine,&filepath);
              if (bVar6) goto LAB_001b8303;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Can not find mumps file : ");
            poVar10 = std::operator<<(poVar10,(string *)&routine);
            poVar10 = std::operator<<(poVar10,"  referenced in this line of mcov data:\n[");
            poVar10 = std::operator<<(poVar10,(string *)&line);
            std::operator<<(poVar10,"]\n");
            pcVar5 = (this->super_cmParseMumpsCoverage).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                         ,0x72,local_450[0],false);
            std::__cxx11::string::~string((string *)local_450);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          }
          std::__cxx11::string::_M_assign((string *)&lastfunction);
          std::__cxx11::string::_M_assign((string *)&lastroutine);
          std::__cxx11::string::_M_assign((string *)&lastpath);
        }
LAB_001b849e:
        std::__cxx11::string::~string((string *)&routine);
        std::__cxx11::string::~string((string *)&function);
        std::__cxx11::string::~string((string *)&filepath);
      }
    }
    std::__cxx11::string::~string((string *)&lastpath);
    std::__cxx11::string::~string((string *)&lastroutine);
    std::__cxx11::string::~string((string *)&lastfunction);
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return (uVar2 & 5) == 0;
}

Assistant:

bool cmParseGTMCoverage::ReadMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    return false;
  }
  std::string line;
  std::string lastfunction;
  std::string lastroutine;
  std::string lastpath;
  int lastoffset = 0;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // only look at lines that have coverage data
    if (line.find("^ZZCOVERAGE") == std::string::npos) {
      continue;
    }
    std::string filepath;
    std::string function;
    std::string routine;
    int linenumber = 0;
    int count = 0;
    this->ParseMCOVLine(line, routine, function, linenumber, count);
    // skip this one
    if (routine == "RSEL") {
      continue;
    }
    // no need to search the file if we just did it
    if (function == lastfunction && lastroutine == routine) {
      if (!lastpath.empty()) {
        this->Coverage.TotalCoverage[lastpath][lastoffset + linenumber] +=
          count;
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Can not find mumps file : "
                     << lastroutine
                     << "  referenced in this line of mcov data:\n"
                        "["
                     << line << "]\n");
      }
      continue;
    }
    // Find the full path to the file
    bool found = this->FindMumpsFile(routine, filepath);
    if (!found && cmHasLiteralSuffix(routine, "%")) {
      routine.erase(0, 1);
      found = this->FindMumpsFile(routine, filepath);
    }
    if (found) {
      int lineoffset = 0;
      if (this->FindFunctionInMumpsFile(filepath, function, lineoffset)) {
        cmCTestCoverageHandlerContainer::SingleFileCoverageVector&
          coverageVector = this->Coverage.TotalCoverage[filepath];
        // This section accounts for lines that were previously marked
        // as non-executable code (-1), if the parser comes back with
        // a non-zero count, increase the count by 1 to push the line
        // into the executable code set in addition to the count found.
        if (coverageVector[lineoffset + linenumber] == -1 && count > 0) {
          coverageVector[lineoffset + linenumber] += count + 1;
        } else {
          coverageVector[lineoffset + linenumber] += count;
        }
        lastoffset = lineoffset;
      }
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Can not find mumps file : "
                   << routine
                   << "  referenced in this line of mcov data:\n"
                      "["
                   << line << "]\n");
    }
    lastfunction = function;
    lastroutine = routine;
    lastpath = filepath;
  }
  return true;
}